

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O3

void record_token_rgb(float *r,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  char *pcVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  char *local_38;
  
  pcVar1 = (tokens->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar5 = *piVar2;
  *piVar2 = 0;
  fVar6 = strtof(pcVar1,&local_38);
  if (local_38 == pcVar1) {
    std::__throw_invalid_argument("stof");
  }
  else {
    iVar4 = *piVar2;
    if (iVar4 == 0) {
LAB_0010b996:
      *piVar2 = iVar5;
      iVar4 = iVar5;
    }
    else if (iVar4 == 0x22) {
      fVar6 = (float)std::__throw_out_of_range("stof");
      goto LAB_0010b996;
    }
    *r = fVar6;
    pcVar1 = (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    *piVar2 = 0;
    fVar6 = strtof(pcVar1,&local_38);
    if (local_38 != pcVar1) {
      iVar5 = *piVar2;
      if (iVar5 == 0) {
LAB_0010b9e2:
        *piVar2 = iVar4;
        iVar5 = iVar4;
      }
      else if (iVar5 == 0x22) {
        fVar6 = (float)std::__throw_out_of_range("stof");
        goto LAB_0010b9e2;
      }
      r[1] = fVar6;
      pcVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      *piVar2 = 0;
      fVar6 = strtof(pcVar1,&local_38);
      if (local_38 != pcVar1) {
        if (*piVar2 != 0) {
          if (*piVar2 != 0x22) goto LAB_0010ba2a;
          fVar6 = (float)std::__throw_out_of_range("stof");
        }
        *piVar2 = iVar5;
LAB_0010ba2a:
        r[2] = fVar6;
        return;
      }
      goto LAB_0010ba57;
    }
  }
  iVar5 = (int)&local_38;
  std::__throw_invalid_argument("stof");
LAB_0010ba57:
  uVar3 = std::__throw_invalid_argument("stof");
  if (*piVar2 == 0) {
    *piVar2 = iVar5;
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void record_token_rgb(vec3 r, const vector<string> tokens){
    r[0] = stof(tokens[1]);
    r[1] = stof(tokens[2]);
    r[2] = stof(tokens[3]);
}